

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

Matcher<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
* __thiscall
testing::internal::EachMatcher::operator_cast_to_Matcher
          (Matcher<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
           *__return_storage_ptr__,EachMatcher *this)

{
  EachMatcherImpl<std::array<std::__cxx11::string,2ul>const&> *this_00;
  EachMatcher<const_char_*> *this_local;
  
  this_00 = (EachMatcherImpl<std::array<std::__cxx11::string,2ul>const&> *)operator_new(0x20);
  EachMatcherImpl<std::array<std::__cxx11::string,2ul>const&>::EachMatcherImpl<char_const*>
            (this_00,*(char **)this);
  Matcher<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
  ::Matcher(__return_storage_ptr__,
            (MatcherInterface<const_std::array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>_&>
             *)this_00);
  return __return_storage_ptr__;
}

Assistant:

operator Matcher<Container>() const {
    return Matcher<Container>(
        new EachMatcherImpl<const Container&>(inner_matcher_));
  }